

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O1

void __thiscall
rapidjson::internal::Stack<rapidjson::CrtAllocator>::
Expand<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Range>
          (Stack<rapidjson::CrtAllocator> *this,size_t count)

{
  char *pcVar1;
  char *pcVar2;
  CrtAllocator *pCVar3;
  char *newCapacity;
  
  pcVar1 = this->stack_;
  if (pcVar1 == (char *)0x0) {
    if (this->allocator_ == (CrtAllocator *)0x0) {
      pCVar3 = (CrtAllocator *)operator_new(1);
      this->allocator_ = pCVar3;
      this->ownAllocator_ = pCVar3;
    }
    pcVar2 = (char *)this->initialCapacity_;
  }
  else {
    pcVar2 = this->stackEnd_ + (((ulong)(this->stackEnd_ + (1 - (long)pcVar1)) >> 1) - (long)pcVar1)
    ;
  }
  newCapacity = this->stackTop_ + (count * 0xc - (long)pcVar1);
  if (this->stackTop_ + (count * 0xc - (long)pcVar1) < pcVar2) {
    newCapacity = pcVar2;
  }
  Resize(this,(size_t)newCapacity);
  return;
}

Assistant:

void Expand(size_t count) {
        // Only expand the capacity if the current stack exists. Otherwise just create a stack with initial capacity.
        size_t newCapacity;
        if (stack_ == 0) {
            if (!allocator_)
                ownAllocator_ = allocator_ = RAPIDJSON_NEW(Allocator)();
            newCapacity = initialCapacity_;
        } else {
            newCapacity = GetCapacity();
            newCapacity += (newCapacity + 1) / 2;
        }
        size_t newSize = GetSize() + sizeof(T) * count;
        if (newCapacity < newSize)
            newCapacity = newSize;

        Resize(newCapacity);
    }